

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t owner_excluded(archive_match *a,archive_entry *entry)

{
  wchar_t wVar1;
  la_int64_t lVar2;
  char *pcVar3;
  
  if ((a->inclusion_uids).count != 0) {
    lVar2 = archive_entry_uid(entry);
    wVar1 = match_owner_id(&a->inclusion_uids,lVar2);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
  }
  if ((a->inclusion_gids).count != 0) {
    lVar2 = archive_entry_gid(entry);
    wVar1 = match_owner_id(&a->inclusion_gids,lVar2);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
  }
  if ((a->inclusion_unames).count != L'\0') {
    pcVar3 = archive_entry_uname(entry);
    wVar1 = match_owner_name_mbs(a,&a->inclusion_unames,pcVar3);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    if (wVar1 < L'\0') {
      return wVar1;
    }
  }
  if ((a->inclusion_gnames).count != L'\0') {
    pcVar3 = archive_entry_gname(entry);
    wVar1 = match_owner_name_mbs(a,&a->inclusion_gnames,pcVar3);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    if (wVar1 < L'\0') {
      return wVar1;
    }
  }
  return L'\0';
}

Assistant:

static int
owner_excluded(struct archive_match *a, struct archive_entry *entry)
{
	int r;

	if (a->inclusion_uids.count) {
		if (!match_owner_id(&(a->inclusion_uids),
		    archive_entry_uid(entry)))
			return (1);
	}

	if (a->inclusion_gids.count) {
		if (!match_owner_id(&(a->inclusion_gids),
		    archive_entry_gid(entry)))
			return (1);
	}

	if (a->inclusion_unames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_unames),
			archive_entry_uname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_unames),
			archive_entry_uname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}

	if (a->inclusion_gnames.count) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = match_owner_name_wcs(a, &(a->inclusion_gnames),
			archive_entry_gname_w(entry));
#else
		r = match_owner_name_mbs(a, &(a->inclusion_gnames),
			archive_entry_gname(entry));
#endif
		if (!r)
			return (1);
		else if (r < 0)
			return (r);
	}
	return (0);
}